

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t * archive_entry_hardlink_w(archive_entry *entry)

{
  wchar_t wVar1;
  int *piVar2;
  archive_entry *local_20;
  wchar_t *p;
  archive_entry *entry_local;
  
  if ((entry->ae_set & 1U) == 0) {
    entry_local = (archive_entry *)0x0;
  }
  else {
    p = (wchar_t *)entry;
    wVar1 = archive_mstring_get_wcs(entry->archive,&entry->ae_linkname,(wchar_t **)&local_20);
    if (wVar1 == L'\0') {
      entry_local = local_20;
    }
    else {
      piVar2 = __errno_location();
      if (*piVar2 == 0xc) {
        __archive_errx(1,"No memory");
      }
      entry_local = (archive_entry *)0x0;
    }
  }
  return (wchar_t *)entry_local;
}

Assistant:

const wchar_t *
archive_entry_hardlink_w(struct archive_entry *entry)
{
	const wchar_t *p;
	if ((entry->ae_set & AE_SET_HARDLINK) == 0)
		return (NULL);
	if (archive_mstring_get_wcs(
	    entry->archive, &entry->ae_linkname, &p) == 0)
		return (p);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}